

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeArrayValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *root;
  long lVar4;
  ArrayIndex index;
  ulong uVar5;
  allocator local_69;
  string local_68;
  string *local_48;
  pointer local_40;
  pointer local_38;
  
  AVar3 = Value::size(value);
  if (AVar3 == 0) {
    std::__cxx11::string::string((string *)&local_68,"[]",&local_69);
    pushValue(this,&local_68);
  }
  else {
    bVar2 = isMultineArray(this,value);
    if (!bVar2) {
      uVar5 = (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar5 == AVar3) {
        psVar1 = &this->document_;
        std::__cxx11::string::append((char *)psVar1);
        lVar4 = 0;
        while (bVar2 = uVar5 != 0, uVar5 = uVar5 - 1, bVar2) {
          if (lVar4 != 0) {
            std::__cxx11::string::append((char *)psVar1);
          }
          std::__cxx11::string::append((string *)psVar1);
          lVar4 = lVar4 + 0x20;
        }
        std::__cxx11::string::append((char *)psVar1);
        return;
      }
      __assert_fail("childValues_.size() == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Expost[P]SimpleFtpServer/jsoncpp.cpp"
                    ,0x11a8,"void Json::StyledWriter::writeArrayValue(const Value &)");
    }
    std::__cxx11::string::string((string *)&local_68,"[",&local_69);
    writeWithIndent(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    indent(this);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = &this->document_;
    index = 0;
    lVar4 = 0;
    while( true ) {
      root = Value::operator[](value,index);
      writeCommentBeforeValue(this,root);
      if (local_38 == local_40) {
        writeIndent(this);
        writeValue(this,root);
      }
      else {
        writeWithIndent(this,(string *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar4));
      }
      if ((ulong)AVar3 * 0x20 + -0x20 == lVar4) break;
      std::__cxx11::string::push_back((char)local_48);
      writeCommentAfterValueOnSameLine(this,root);
      lVar4 = lVar4 + 0x20;
      index = index + 1;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    std::__cxx11::string::string((string *)&local_68,"]",&local_69);
    writeWithIndent(this,&local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void StyledWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      document_ += "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          document_ += ", ";
        document_ += childValues_[index];
      }
      document_ += " ]";
    }
  }
}